

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::hide_helper(QWidgetPrivate *this)

{
  bool bVar1;
  bool bVar2;
  WindowType WVar3;
  QWidgetPrivate *this_00;
  QGraphicsProxyWidget *pQVar4;
  QWidgetRepaintManager *this_01;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetRepaintManager *repaintManager;
  QWidget *fw;
  bool wasVisible;
  bool isEmbedded;
  QWidget *q;
  QHideEvent hideEvent;
  QAccessibleEvent event;
  QWidget *in_stack_00000098;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  byte bVar5;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar6;
  QWidgetPrivate *in_stack_ffffffffffffffa0;
  QWidgetPrivate *in_stack_ffffffffffffffa8;
  undefined1 spontaneous;
  QWidgetPrivate *popup;
  QApplicationPrivate *in_stack_ffffffffffffffc8;
  QApplicationPrivate *this_02;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined8 in_stack_fffffffffffffff0;
  QWidget *this_03;
  
  this_03 = *(QWidget **)(in_FS_OFFSET + 0x28);
  popup = in_RDI;
  this_00 = (QWidgetPrivate *)q_func(in_RDI);
  bVar1 = QWidget::isWindow((QWidget *)in_RDI);
  uVar6 = false;
  if (bVar1) {
    bVar1 = bypassGraphicsProxyWidget
                      ((QWidget *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    uVar6 = false;
    if (!bVar1) {
      QWidget::parentWidget((QWidget *)0x37962e);
      pQVar4 = nearestGraphicsProxyWidget
                         ((QWidget *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      uVar6 = pQVar4 != (QGraphicsProxyWidget *)0x0;
    }
  }
  spontaneous = uVar6;
  if (((bool)uVar6 == false) && (WVar3 = QWidget::windowType((QWidget *)in_RDI), WVar3 == Popup)) {
    QCoreApplication::instance();
    QApplication::d_func((QApplication *)0x37966e);
    QApplicationPrivate::closePopup(in_stack_ffffffffffffffc8,(QWidget *)popup);
  }
  QWidget::setAttribute
            (this_03,(WidgetAttribute)((ulong)in_stack_fffffffffffffff0 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffff0 >> 0x18,0));
  hide_sys(in_stack_ffffffffffffffa8);
  bVar1 = QWidget::testAttribute
                    ((QWidget *)CONCAT17(uVar6,in_stack_ffffffffffffff98),
                     (WidgetAttribute)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    QWidget::setAttribute
              (this_03,(WidgetAttribute)((ulong)in_stack_fffffffffffffff0 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffff0 >> 0x18,0));
  }
  this_02 = (QApplicationPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QHideEvent::QHideEvent((QHideEvent *)&stack0xffffffffffffffc8);
  QCoreApplication::sendEvent((QObject *)this_00,(QEvent *)&stack0xffffffffffffffc8);
  hideChildren(this_00,(bool)spontaneous);
  if (bVar1) {
    QCoreApplication::instance();
    QApplication::d_func((QApplication *)0x379718);
    QApplicationPrivate::sendSyntheticEnterLeave(this_02,in_stack_00000098);
    in_stack_ffffffffffffffa8 = (QWidgetPrivate *)QApplication::focusWidget();
    while( true ) {
      bVar5 = 0;
      if (in_stack_ffffffffffffffa8 != (QWidgetPrivate *)0x0) {
        bVar2 = QWidget::isWindow((QWidget *)in_RDI);
        bVar5 = bVar2 ^ 0xff;
      }
      if ((bVar5 & 1) == 0) goto LAB_0037978b;
      if (in_stack_ffffffffffffffa8 == this_00) break;
      in_stack_ffffffffffffffa8 = (QWidgetPrivate *)QWidget::parentWidget((QWidget *)0x379782);
    }
    (**(code **)(*(long *)this_00 + 0x198))(this_00,1);
  }
LAB_0037978b:
  this_01 = maybeRepaintManager(in_stack_ffffffffffffffa0);
  if (this_01 != (QWidgetRepaintManager *)0x0) {
    QWidgetRepaintManager::removeDirtyWidget(this_01,(QWidget *)in_stack_ffffffffffffffa8);
  }
  if (bVar1) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QAccessibleEvent::QAccessibleEvent((QAccessibleEvent *)&local_28,(QObject *)this_00,ObjectHide);
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_28);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_28);
  }
  QHideEvent::~QHideEvent((QHideEvent *)&stack0xffffffffffffffc8);
  if (*(QWidget **)(in_FS_OFFSET + 0x28) != this_03) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::hide_helper()
{
    Q_Q(QWidget);

    bool isEmbedded = false;
#if QT_CONFIG(graphicsview)
    isEmbedded = q->isWindow() && !bypassGraphicsProxyWidget(q) && nearestGraphicsProxyWidget(q->parentWidget()) != nullptr;
#else
    Q_UNUSED(isEmbedded);
#endif

    if (!isEmbedded && (q->windowType() == Qt::Popup))
        qApp->d_func()->closePopup(q);

    q->setAttribute(Qt::WA_Mapped, false);
    hide_sys();

    bool wasVisible = q->testAttribute(Qt::WA_WState_Visible);

    if (wasVisible) {
        q->setAttribute(Qt::WA_WState_Visible, false);

    }

    QHideEvent hideEvent;
    QCoreApplication::sendEvent(q, &hideEvent);
    hideChildren(false);

    // next bit tries to move the focus if the focus widget is now
    // hidden.
    if (wasVisible) {
        qApp->d_func()->sendSyntheticEnterLeave(q);
        QWidget *fw = QApplication::focusWidget();
        while (fw &&  !fw->isWindow()) {
            if (fw == q) {
                q->focusNextPrevChild(true);
                break;
            }
            fw = fw->parentWidget();
        }
    }

    if (QWidgetRepaintManager *repaintManager = maybeRepaintManager())
        repaintManager->removeDirtyWidget(q);

#if QT_CONFIG(accessibility)
    if (wasVisible) {
        QAccessibleEvent event(q, QAccessible::ObjectHide);
        QAccessible::updateAccessibility(&event);
    }
#endif
}